

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::alert_manager::
emplace_alert<libtorrent::scrape_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int_const&,int_const&,std::__cxx11::string_const&,libtorrent::protocol_version_const&>
          (alert_manager *this,torrent_handle *args,basic_endpoint<boost::asio::ip::tcp> *args_1,
          int *args_2,int *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          protocol_version *args_5)

{
  int iVar1;
  value_type *this_00;
  value_type *args_00;
  type a;
  unique_lock<std::recursive_mutex> lock_1;
  bad_alloc *anon_var_0;
  scrape_reply_alert *alert;
  heterogeneous_queue<libtorrent::alert> *queue;
  undefined1 local_48 [8];
  unique_lock<std::recursive_mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_4;
  int *args_local_3;
  int *args_local_2;
  basic_endpoint<boost::asio::ip::tcp> *args_local_1;
  torrent_handle *args_local;
  alert_manager *this_local;
  
  lock._8_8_ = args_4;
  ::std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)local_48,&this->m_mutex);
  this_00 = container_wrapper<libtorrent::heterogeneous_queue<libtorrent::alert>,_long,_std::array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>_>
            ::operator[](&this->m_alerts,(long)this->m_generation);
  iVar1 = heterogeneous_queue<libtorrent::alert>::size(this_00);
  if (iVar1 / 3 < this->m_queue_size_limit) {
    args_00 = container_wrapper<libtorrent::aux::stack_allocator,_long,_std::array<libtorrent::aux::stack_allocator,_2UL>_>
              ::operator[](&this->m_allocations,(long)this->m_generation);
    a = heterogeneous_queue<libtorrent::alert>::
        emplace_back<libtorrent::scrape_reply_alert,libtorrent::aux::stack_allocator&,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int_const&,int_const&,std::__cxx11::string_const&,libtorrent::protocol_version_const&>
                  (this_00,args_00,args,args_1,args_2,args_3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_,
                   args_5);
    maybe_notify(this,(alert *)a);
  }
  else {
    ::std::bitset<128UL>::set(&this->m_dropped,0xd,true);
  }
  ::std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_48);
  return;
}

Assistant:

void emplace_alert(Args&&... args) try
		{
			std::unique_lock<std::recursive_mutex> lock(m_mutex);

			heterogeneous_queue<alert>& queue = m_alerts[m_generation];

			// don't add more than this number of alerts, unless it's a
			// high priority alert, in which case we try harder to deliver it
			// for high priority alerts, double the upper limit
			if (queue.size() / (1 + static_cast<int>(T::priority)) >= m_queue_size_limit)
			{
				// record that we dropped an alert of this type
				m_dropped.set(T::alert_type);
				return;
			}

			T& alert = queue.emplace_back<T>(
				m_allocations[m_generation], std::forward<Args>(args)...);

			maybe_notify(&alert);
		}
		catch (std::bad_alloc const&)
		{
			// record that we dropped an alert of this type
			std::unique_lock<std::recursive_mutex> lock(m_mutex);
			m_dropped.set(T::alert_type);
		}